

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  void *pvVar1;
  HuffmanTree *in_RCX;
  HuffmanTree *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  uint error;
  uint *in_stack_00000030;
  uint *in_stack_00000038;
  uint local_30;
  HuffmanTree *local_28;
  uint local_4;
  
  for (local_28 = in_RCX;
      *(int *)(in_RSI + (long)((long)&local_28[-1].table_value + 7) * 4) == 0 && in_RDX < local_28;
      local_28 = (HuffmanTree *)((long)&local_28[-1].table_value + 7)) {
  }
  pvVar1 = lodepng_malloc(0x665008);
  *(void **)(in_RDI + 8) = pvVar1;
  if (*(long *)(in_RDI + 8) == 0) {
    local_4 = 0x53;
  }
  else {
    *(undefined4 *)(in_RDI + 0x10) = in_R8D;
    *(int *)(in_RDI + 0x14) = (int)local_28;
    local_30 = lodepng_huffman_code_lengths
                         (in_stack_00000038,in_stack_00000030,(size_t)tree,frequencies._4_4_);
    if (local_30 == 0) {
      local_30 = HuffmanTree_makeFromLengths2(in_RDX);
    }
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}